

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O3

double runWBICMetropolis(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *frequencyMatrix,
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *docVoca,vector<double,_std::allocator<double>_> *alpha,
                        vector<double,_std::allocator<double>_> *beta,uint n)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint K;
  uint D;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phiCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  thetaCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  theta;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixUniform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixUniform;
  random_device rnd;
  mt19937 mt;
  int local_2988;
  double local_2980;
  double local_2970;
  uint local_2960;
  uint local_295c;
  double local_2958;
  double local_2950;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2948;
  double local_2940;
  ulong local_2938;
  double local_2930;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2928;
  double local_2920;
  double local_2918;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2910;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28e0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2898;
  double local_2880;
  vector<double,_std::allocator<double>_> *local_2878;
  double local_2870;
  double local_2868;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2860;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2848;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2830;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2818;
  vector<double,_std::allocator<double>_> local_2800;
  vector<double,_std::allocator<double>_> local_27e8;
  vector<double,_std::allocator<double>_> local_27d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_27b8;
  vector<double,_std::allocator<double>_> local_27a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2788;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2770;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  uVar9 = ((long)(docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar8 = (uint)uVar9;
  uVar14 = (ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar13 = (uint)uVar14;
  uVar6 = (ulong)((long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_2988 = (int)uVar6;
  if (n == 0) {
    if (uVar8 == 0) {
      n = 0;
    }
    else {
      uVar10 = 0;
      n = 0;
      do {
        if (local_2988 != 0) {
          uVar11 = 0;
          do {
            n = n + *(int *)(*(long *)&(frequencyMatrix->
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while ((uVar6 & 0xffffffff) != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar9 & 0xffffffff));
    }
  }
  uVar11 = uVar9 & 0xffffffff;
  local_2960 = uVar13;
  local_295c = uVar8;
  local_2948 = frequencyMatrix;
  local_2928 = docVoca;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2898,uVar11,alpha,(allocator_type *)&local_2740);
  uVar10 = uVar14 & 0xffffffff;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_28b0,uVar10,beta,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2848,uVar11,alpha,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2860,uVar10,beta,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2818,uVar11,alpha,(allocator_type *)&local_2740);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_2830,uVar10,beta,(allocator_type *)&local_2740);
  auVar4 = _DAT_0010a090;
  auVar3 = _DAT_0010a080;
  if (uVar8 != 0) {
    lVar12 = (uVar14 & 0xffffffff) - 1;
    auVar16._8_4_ = (int)lVar12;
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar16 = auVar16 ^ _DAT_0010a090;
    do {
      if (uVar13 != 0) {
        pdVar1 = local_2818.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = 0;
        auVar17 = auVar3;
        do {
          auVar19 = auVar17 ^ auVar4;
          if ((bool)(~(auVar16._4_4_ < auVar19._4_4_ ||
                      auVar16._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar16._4_4_) & 1)) {
            pdVar1[uVar11] = 1.0;
          }
          if (auVar19._12_4_ <= auVar16._12_4_ &&
              (auVar19._8_4_ <= auVar16._8_4_ || auVar19._12_4_ != auVar16._12_4_)) {
            pdVar1[uVar11 + 1] = 1.0;
          }
          uVar11 = uVar11 + 2;
          lVar12 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar12 + 2;
        } while (((uVar14 & 0xffffffff) + 1 & 0x1fffffffe) != uVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar9 & 0xffffffff));
  }
  auVar4 = _DAT_0010a090;
  auVar3 = _DAT_0010a080;
  if (uVar13 != 0) {
    lVar12 = (uVar6 & 0xffffffff) - 1;
    auVar19._8_4_ = (int)lVar12;
    auVar19._0_8_ = lVar12;
    auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar10 = 0;
    auVar19 = auVar19 ^ _DAT_0010a090;
    do {
      if (local_2988 != 0) {
        pdVar1 = local_2830.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = 0;
        auVar18 = auVar3;
        do {
          auVar16 = auVar18 ^ auVar4;
          if ((bool)(~(auVar19._4_4_ < auVar16._4_4_ ||
                      auVar19._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar19._4_4_) & 1)) {
            pdVar1[uVar11] = 1.0;
          }
          if (auVar16._12_4_ <= auVar19._12_4_ &&
              (auVar16._8_4_ <= auVar19._8_4_ || auVar16._12_4_ != auVar19._12_4_)) {
            pdVar1[uVar11 + 1] = 1.0;
          }
          uVar11 = uVar11 + 2;
          lVar12 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar12 + 2;
        } while (((uVar6 & 0xffffffff) + 1 & 0x1fffffffe) != uVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar14 & 0xffffffff));
  }
  samplingParamFromDirichlet(&local_28c8,&local_2818,&local_295c);
  samplingParamFromDirichlet(&local_28e0,&local_2830,&local_2960);
  local_2950 = calculateLogLikelihood(&local_28c8,&local_28e0,local_2948,local_2928);
  std::vector<double,_std::allocator<double>_>::vector(&local_27d0,alpha);
  std::vector<double,_std::allocator<double>_>::vector(&local_27e8,beta);
  dVar15 = calculateLogPriorDistributionValue(&local_28c8,&local_28e0,&local_27d0,&local_27e8);
  if (local_27e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_27e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_27d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_27d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2880 = (double)n;
  local_2930 = log(local_2880);
  std::random_device::random_device(&local_2740);
  uVar5 = std::random_device::_M_getval();
  local_2920 = (1.0 / local_2930) * local_2950 + dVar15;
  local_13b8._M_x[0] = (unsigned_long)uVar5;
  lVar12 = 1;
  uVar10 = local_13b8._M_x[0];
  do {
    uVar10 = (ulong)(((uint)(uVar10 >> 0x1e) ^ (uint)uVar10) * 0x6c078965 + (int)lVar12);
    local_13b8._M_x[lVar12] = uVar10;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x270);
  local_13b8._M_p = 0x270;
  if (uVar8 != 0) {
    uVar10 = 0;
    do {
      if (uVar13 != 0) {
        pdVar1 = local_28c8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_2898.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = 0;
        do {
          pdVar2[uVar11] = pdVar1[uVar11] * (double)(uVar13 * 999) + 1.0;
          uVar11 = uVar11 + 1;
        } while ((uVar14 & 0xffffffff) != uVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar9 & 0xffffffff));
  }
  if (uVar13 == 0) {
    local_2970 = (double)(uint)(local_2988 * 999);
  }
  else {
    local_2970 = (double)(uint)(local_2988 * 999);
    uVar10 = 0;
    do {
      if (local_2988 != 0) {
        pdVar1 = local_28e0.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar2 = local_28b0.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar11 = 0;
        do {
          pdVar2[uVar11] = pdVar1[uVar11] * local_2970 + 1.0;
          uVar11 = uVar11 + 1;
        } while ((uVar6 & 0xffffffff) != uVar11);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar14 & 0xffffffff));
  }
  local_2930 = (double)(uVar13 * 999);
  local_2980 = 0.0;
  local_2938 = 0;
  local_2878 = alpha;
  do {
    samplingParamFromDirichlet(&local_28f8,&local_2898,&local_295c);
    samplingParamFromDirichlet(&local_2910,&local_28b0,&local_2960);
    if (uVar8 != 0) {
      uVar10 = 0;
      do {
        if (uVar13 != 0) {
          pdVar1 = local_28f8.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = local_2848.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            pdVar2[uVar11] = pdVar1[uVar11] * local_2930 + 1.0;
            uVar11 = uVar11 + 1;
          } while ((uVar14 & 0xffffffff) != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar9 & 0xffffffff));
    }
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        if (local_2988 != 0) {
          pdVar1 = local_2910.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2 = local_2860.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            pdVar2[uVar11] = pdVar1[uVar11] * local_2970 + 1.0;
            uVar11 = uVar11 + 1;
          } while ((uVar6 & 0xffffffff) != uVar11);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar14 & 0xffffffff));
    }
    local_2918 = calculateLogLikelihood(&local_28f8,&local_2910,local_2948,local_2928);
    std::vector<double,_std::allocator<double>_>::vector(&local_2800,local_2878);
    std::vector<double,_std::allocator<double>_>::vector(&local_27a0,beta);
    local_2958 = calculateLogPriorDistributionValue(&local_28f8,&local_2910,&local_2800,&local_27a0)
    ;
    if (local_27a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_27a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2800.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2800.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_2940 = log(local_2880);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_27b8,&local_2898);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2758,&local_28b0);
    local_2868 = calculateLogProposalDistributionValue
                           (&local_28f8,&local_2910,&local_27b8,&local_2758);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2758);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_27b8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2770,&local_2848);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2788,&local_2860);
    local_2870 = calculateLogProposalDistributionValue
                           (&local_28c8,&local_28e0,&local_2770,&local_2788);
    local_2958 = (1.0 / local_2940) * local_2918 + local_2958;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2788);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2770);
    local_2940 = exp(((local_2958 - local_2920) + local_2870) - local_2868);
    dVar15 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&local_13b8);
    if (dVar15 < local_2940) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28c8,&local_28f8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28e0,&local_2910);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_2898,&local_2848);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&local_28b0,&local_2860);
      local_2950 = local_2918;
      local_2920 = local_2958;
    }
    if ((49999 < (uint)local_2938) &&
       (uVar5 = (uint)local_2938 * -0x3d70a3d7 + 0xc28f5459,
       (uVar5 >> 2 | uVar5 * 0x40000000) < 0x28f5c29)) {
      local_2980 = local_2980 + local_2950;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2910);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_28f8);
    uVar5 = (int)local_2938 + 1;
    local_2938 = (ulong)uVar5;
  } while (uVar5 != 60000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"acceptanceTimes: ",0x11)
  ;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::random_device::_M_fini();
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28e0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28c8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2830);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2818);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2860);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2848);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28b0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_2898);
  return local_2980 / 100.0;
}

Assistant:

double runWBICMetropolis(const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca, const vector<double> &alpha, const vector<double> &beta, unsigned int n){
    unsigned int D = docVoca.size(), K = alpha.size(), V = beta.size();
    if(n==0){
        for(int d=0; d<D; d++){
            for(int v=0; v<V; v++){
                n += frequencyMatrix[d][v];
            }
        }
    }
    vector<vector<double> > alphaMatrix(D, alpha);
    vector<vector<double> > betaMatrix(K, beta);
    vector<vector<double> > alphaMatrixCandidate(D, alpha);
    vector<vector<double> > betaMatrixCandidate(K, beta);
    vector<vector<double> > alphaMatrixUniform(D, alpha);
    vector<vector<double> > betaMatrixUniform(K, beta);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrixUniform[d][k] = 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrixUniform[k][v] = 1;
        }
    }
    unsigned int iteration = 60000;
    unsigned int burnIn = 50000;
    unsigned int samplingInterval = 100;
    const unsigned int RATE = 1000;
    unsigned int samplingTimes = (iteration - burnIn) / samplingInterval;
    unsigned int acceptanceTimes = 0;
    double logLikelihoodAverage = 0.0;
    vector<vector<double> > theta = samplingParamFromDirichlet(alphaMatrixUniform, D);
    vector<vector<double> > phi = samplingParamFromDirichlet(betaMatrixUniform, K);
    double logLikelihood = calculateLogLikelihood(theta, phi, frequencyMatrix, docVoca);
    double logPriorDistributionValue = calculateLogPriorDistributionValue(theta, phi, alpha, beta);
    double logTargetDistributionValue = calculateLogTargetDistributionValue(logLikelihood, logPriorDistributionValue, n);
    // double logTargetDistributionValue = 0;
    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0,1);
    const unsigned int alphaSum = RATE * K;
    const unsigned int betaSum = RATE * V;
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrix[d][k] = theta[d][k] * (alphaSum - K) + 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrix[k][v] = phi[k][v] * (betaSum - V) + 1;
        }
    }
    for(int i=0; i<iteration; i++){
        vector<vector<double> > thetaCandidate = samplingParamFromDirichlet(alphaMatrix, D);
        vector<vector<double> > phiCandidate = samplingParamFromDirichlet(betaMatrix, K);

        for(int d=0; d<D; d++){
            for(int k=0; k<K; k++){
                alphaMatrixCandidate[d][k] = thetaCandidate[d][k] * (alphaSum - K) + 1;
            }
        }
        for(int k=0; k<K; k++){
            for(int v=0; v<V; v++){
                betaMatrixCandidate[k][v] = phiCandidate[k][v] * (betaSum - V) + 1;
            }
        }
        double logLikelihoodCandidate = calculateLogLikelihood(thetaCandidate, phiCandidate, frequencyMatrix, docVoca);
        double logPriorDistributionValueCandidate = calculateLogPriorDistributionValue(thetaCandidate, phiCandidate, alpha, beta);
        double logTargetDistributionValueCandidate = calculateLogTargetDistributionValue(logLikelihoodCandidate, logPriorDistributionValueCandidate, n);
        double logProposalDistributionValueToCandidate = calculateLogProposalDistributionValue(thetaCandidate, phiCandidate, alphaMatrix, betaMatrix);
        double logProposalDistributionValueToSample = calculateLogProposalDistributionValue(theta, phi, alphaMatrixCandidate, betaMatrixCandidate);

        double acceptanceProb = exp(logTargetDistributionValueCandidate - logTargetDistributionValue + logProposalDistributionValueToSample - logProposalDistributionValueToCandidate);
        double randomValue = randN(mt);
        if(acceptanceProb > randomValue){
            acceptanceTimes += 1;
            theta = thetaCandidate;
            phi = phiCandidate;
            alphaMatrix = alphaMatrixCandidate;
            betaMatrix = betaMatrixCandidate;
            logLikelihood = logLikelihoodCandidate;
            logPriorDistributionValue = logPriorDistributionValueCandidate;
            logTargetDistributionValue = logTargetDistributionValueCandidate;
        }
        if((i > burnIn-1) && (i-burnIn+1)%samplingInterval == 0){
            logLikelihoodAverage += logLikelihood;
        }
    }
    logLikelihoodAverage /= samplingTimes;
    cout<<"acceptanceTimes: "<<acceptanceTimes<<endl;
    return logLikelihoodAverage;
}